

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void * pugi::impl::anon_unknown_0::document_buffer_order(xpath_node *xnode)

{
  ulong uVar1;
  xml_attribute_struct *pxVar2;
  xml_node local_10;
  
  if ((xnode->_attribute)._attr == (xml_attribute_struct *)0x0) {
    local_10._root = (xnode->_node)._root;
  }
  else {
    xml_node::xml_node(&local_10);
  }
  if (local_10._root == (xml_node_struct *)0x0) {
    pxVar2 = (xnode->_attribute)._attr;
    if ((pxVar2 != (xml_attribute_struct *)0x0) &&
       (uVar1 = pxVar2->header,
       (*(byte *)(*(long *)((long)pxVar2 - (uVar1 >> 8)) + -0x40) & 0x40) == 0)) {
      if ((uVar1 & 0x60) == 0) {
        return pxVar2->name;
      }
      if ((uVar1 & 0x50) == 0) {
        return pxVar2->value;
      }
    }
  }
  else {
    uVar1 = (local_10._root)->header;
    if ((*(byte *)(*(long *)((long)local_10._root - (uVar1 >> 8)) + -0x40) & 0x40) == 0) {
      if ((uVar1 & 0x60) == 0 && (local_10._root)->name != (char_t *)0x0) {
        return (local_10._root)->name;
      }
      if ((uVar1 & 0x50) == 0 && (local_10._root)->value != (char_t *)0x0) {
        return (local_10._root)->value;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

PUGI_IMPL_FN const void* document_buffer_order(const xpath_node& xnode)
	{
		xml_node_struct* node = xnode.node().internal_object();

		if (node)
		{
			if ((get_document(node).header & xml_memory_page_contents_shared_mask) == 0)
			{
				if (node->name && (node->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0) return node->name;
				if (node->value && (node->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0) return node->value;
			}

			return NULL;
		}

		xml_attribute_struct* attr = xnode.attribute().internal_object();

		if (attr)
		{
			if ((get_document(attr).header & xml_memory_page_contents_shared_mask) == 0)
			{
				if ((attr->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0) return attr->name;
				if ((attr->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0) return attr->value;
			}

			return NULL;
		}

		return NULL;
	}